

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddLinkLibrary(cmTarget *this,cmMakefile *mf,string *lib,cmTargetLinkLibraryType llt)

{
  cmAlphaNum *this_00;
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmTarget *this_01;
  size_type sVar5;
  pointer pcVar6;
  string *psVar7;
  byte local_181;
  cmValue local_180;
  cmValue old_val;
  string dependencies;
  cmAlphaNum local_128;
  undefined1 local_f8 [8];
  string targetEntry;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string libName;
  bool isNonImportedTarget;
  cmTarget *tgt;
  string *psStack_20;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  tgt._4_4_ = llt;
  psStack_20 = lib;
  lib_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  this_01 = cmMakefile::FindTargetToUse(mf,lib,false);
  local_181 = 0;
  if (this_01 != (cmTarget *)0x0) {
    bVar1 = IsImported(this_01);
    local_181 = bVar1 ^ 0xff;
  }
  libName.field_2._M_local_buf[0xf] = local_181 & 1;
  if ((libName.field_2._M_local_buf[0xf] == 0) || (tgt._4_4_ == GENERAL_LibraryType)) {
    std::__cxx11::string::string((string *)local_58,(string *)psStack_20);
  }
  else {
    targetNameGenex((string *)local_58,psStack_20);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"LINK_LIBRARIES",&local_79)
  ;
  GetDebugGeneratorExpressions(&local_b0,this,(string *)local_58,tgt._4_4_);
  cmMakefile::GetBacktrace((cmMakefile *)((long)&targetEntry.field_2 + 8));
  std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
            ((optional<cmListFileBacktrace> *)&stack0xffffffffffffff38,
             (cmListFileBacktrace *)((long)&targetEntry.field_2 + 8));
  AppendProperty(this,&local_78,&local_b0,(optional<cmListFileBacktrace> *)&stack0xffffffffffffff38,
                 false);
  std::optional<cmListFileBacktrace>::~optional
            ((optional<cmListFileBacktrace> *)&stack0xffffffffffffff38);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&targetEntry.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)local_58);
  sVar5 = cmGeneratorExpression::Find(psStack_20);
  if ((sVar5 == 0xffffffffffffffff) &&
     ((this_01 == (cmTarget *)0x0 ||
      ((TVar3 = GetType(this_01), TVar3 != INTERFACE_LIBRARY &&
       (TVar3 = GetType(this_01), TVar3 != OBJECT_LIBRARY)))))) {
    pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    _Var2 = std::operator==(&pcVar6->Name,psStack_20);
    if (!_Var2) {
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      std::
      vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
      ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                  *)&pcVar6->OriginalLinkLibraries,psStack_20,
                 (cmTargetLinkLibraryType *)((long)&tgt + 4));
      pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      if (((0 < (int)pcVar6->TargetType) &&
          (pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl), (int)pcVar6->TargetType < 4)) &&
         ((PVar4 = GetPolicyStatusCMP0073(this), PVar4 == OLD ||
          (PVar4 = GetPolicyStatusCMP0073(this), PVar4 == WARN)))) {
        pcVar6 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmAlphaNum::cmAlphaNum(&local_128,&pcVar6->Name);
        this_00 = (cmAlphaNum *)((long)&dependencies.field_2 + 8);
        cmAlphaNum::cmAlphaNum(this_00,"_LIB_DEPENDS");
        cmStrCat<>((string *)local_f8,&local_128,this_00);
        std::__cxx11::string::string((string *)&old_val);
        local_180 = cmMakefile::GetDefinition(lib_local,(string *)local_f8);
        bVar1 = cmValue::operator_cast_to_bool(&local_180);
        if (bVar1) {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_180);
          std::__cxx11::string::operator+=((string *)&old_val,(string *)psVar7);
        }
        if (tgt._4_4_ == GENERAL_LibraryType) {
          std::__cxx11::string::operator+=((string *)&old_val,"general");
        }
        else if (tgt._4_4_ == DEBUG_LibraryType) {
          std::__cxx11::string::operator+=((string *)&old_val,"debug");
        }
        else if (tgt._4_4_ == OPTIMIZED_LibraryType) {
          std::__cxx11::string::operator+=((string *)&old_val,"optimized");
        }
        std::__cxx11::string::operator+=((string *)&old_val,";");
        std::__cxx11::string::operator+=((string *)&old_val,(string *)psStack_20);
        std::__cxx11::string::operator+=((string *)&old_val,";");
        cmMakefile::AddCacheDefinition
                  ((cmMakefile *)lib_local,(string *)local_f8,(string *)&old_val,
                   "Dependencies for the target",STATIC,false);
        std::__cxx11::string::~string((string *)&old_val);
        std::__cxx11::string::~string((string *)local_f8);
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
    this->AppendProperty("LINK_LIBRARIES",
                         this->GetDebugGeneratorExpressions(libName, llt),
                         mf.GetBacktrace());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->impl->Name == lib)) {
    return;
  }

  this->impl->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->impl->TargetType >= cmStateEnums::STATIC_LIBRARY &&
      this->impl->TargetType <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = cmStrCat(this->impl->Name, "_LIB_DEPENDS");
    std::string dependencies;
    cmValue old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += *old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies,
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}